

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_solid_destination_out
               (uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = ~color >> 0x18;
  if (const_alpha != 0xff) {
    uVar2 = ((uVar2 * const_alpha + (uVar2 * const_alpha >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff
             ) - const_alpha) + 0xff;
  }
  if (0 < length) {
    uVar1 = 0;
    do {
      uVar4 = (dest[uVar1] & 0xff00ff) * uVar2;
      uVar3 = (dest[uVar1] >> 8 & 0xff00ff) * uVar2;
      dest[uVar1] = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00 |
                    uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

static void composition_solid_destination_out(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    uint32_t a = plutovg_alpha(~color);
    if(const_alpha != 255)
        a = BYTE_MUL(a, const_alpha) + 255 - const_alpha;
    for(int i = 0; i < length; i++) {
        dest[i] = BYTE_MUL(dest[i], a);
    }
}